

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

lbool __thiscall Gluco::Solver::search(Solver *this,int nof_conflicts)

{
  ulong uVar1;
  long lVar2;
  FILE *__stream;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  Lit p_00;
  int *piVar14;
  Lit *pLVar15;
  Clause *pCVar16;
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  double dVar17;
  uint *in_stack_fffffffffffffda8;
  undefined4 uVar18;
  int local_1e8;
  int local_f0;
  lbool local_ad;
  int local_ac;
  lbool local_a6;
  lbool local_a5;
  int local_a4;
  lbool local_9d;
  Lit local_9c;
  Lit local_98;
  Lit p;
  Lit next;
  int bt;
  int local_88;
  CRef cr;
  int local_80;
  uint local_7c;
  undefined4 local_78;
  int i;
  byte local_6d;
  CRef confl;
  uint uStack_68;
  bool blocked;
  uint szWoutSelectors;
  uint nblevels;
  undefined1 local_58 [8];
  vec<Gluco::Lit> selectors;
  vec<Gluco::Lit> learnt_clause;
  int local_30;
  int conflictC;
  int backtrack_level;
  int nof_conflicts_local;
  Solver *this_local;
  
  conflictC = nof_conflicts;
  _backtrack_level = this;
  if ((this->ok & 1U) == 0) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x410,"lbool Gluco::Solver::search(int)");
  }
  vec<Gluco::Lit>::vec((vec<Gluco::Lit> *)&selectors.sz);
  vec<Gluco::Lit>::vec((vec<Gluco::Lit> *)local_58);
  local_6d = 0;
  this->starts = this->starts + 1;
  while( true ) {
    while( true ) {
      i = propagate(this);
      uVar18 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
      if (i == 0xffffffff) break;
      this->conflicts = this->conflicts + 1;
      this->conflictsRestarts = this->conflictsRestarts + 1;
      if ((this->conflicts % 5000 == 0) && (this->var_decay <= 0.95 && this->var_decay != 0.95)) {
        this->var_decay = this->var_decay + 0.01;
      }
      if ((0 < this->verbosity) && (this->conflicts % (long)this->verbEveryConflicts == 0)) {
        uVar1 = this->starts;
        lVar2 = this->conflicts;
        iVar3 = this->nbstopsrestarts;
        iVar4 = this->dec_vars;
        iVar10 = vec<int>::size(&this->trail_lim);
        if (iVar10 == 0) {
          local_f0 = vec<Gluco::Lit>::size(&this->trail);
        }
        else {
          piVar14 = vec<int>::operator[](&this->trail_lim,0);
          local_f0 = *piVar14;
        }
        uVar11 = nClauses(this);
        iVar5 = this->nbReduceDB;
        iVar6 = this->clauses_literals;
        iVar10 = nLearnts(this);
        iVar7 = this->nbRemovedClauses;
        iVar8 = this->nbDL2;
        dVar17 = progressEstimate(this);
        printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n",
               dVar17 * 100.0,uVar1 & 0xffffffff,(ulong)(uint)iVar3,lVar2 / (long)uVar1 & 0xffffffff
               ,(ulong)(uint)((int)iVar4 - local_f0),(ulong)uVar11,CONCAT44(uVar18,(int)iVar6),
               (int)iVar5,iVar10,(int)iVar8,(int)iVar7);
      }
      iVar10 = decisionLevel(this);
      if (iVar10 == 0) {
        lbool::lbool((lbool *)((long)&this_local + 7),'\x01');
        goto LAB_007297a0;
      }
      uVar11 = vec<Gluco::Lit>::size(&this->trail);
      bqueue<unsigned_int>::push(&this->trailQueue,uVar11);
      if ((10000 < this->conflictsRestarts) &&
         (iVar10 = bqueue<unsigned_int>::isvalid(&this->lbdQueue), iVar10 != 0)) {
        iVar10 = vec<Gluco::Lit>::size(&this->trail);
        dVar17 = this->R;
        uVar11 = bqueue<unsigned_int>::getavg(&this->trailQueue);
        if (dVar17 * (double)uVar11 < (double)iVar10) {
          bqueue<unsigned_int>::fastclear(&this->lbdQueue);
          this->nbstopsrestarts = this->nbstopsrestarts + 1;
          if ((local_6d & 1) == 0) {
            this->lastblockatrestart = this->starts;
            this->nbstopsrestartssame = this->nbstopsrestartssame + 1;
            local_6d = 1;
          }
        }
      }
      vec<Gluco::Lit>::clear((vec<Gluco::Lit> *)&selectors.sz,false);
      vec<Gluco::Lit>::clear((vec<Gluco::Lit> *)local_58,false);
      in_stack_fffffffffffffda8 = &confl;
      piVar14 = &local_30;
      analyze(this,i,(vec<Gluco::Lit> *)&selectors.sz,(vec<Gluco::Lit> *)local_58,piVar14,
              &stack0xffffffffffffff98,in_stack_fffffffffffffda8);
      bqueue<unsigned_int>::push(&this->lbdQueue,uStack_68);
      this->sumLBD = this->sumLBD + (float)uStack_68;
      cancelUntil(this,local_30);
      if ((this->certifiedUNSAT & 1U) != 0) {
        local_7c = 0;
        while( true ) {
          uVar11 = local_7c;
          uVar12 = vec<Gluco::Lit>::size((vec<Gluco::Lit> *)&selectors.sz);
          tbs = (uchar *)(ulong)uVar12;
          if ((int)uVar12 <= (int)uVar11) break;
          __stream = (FILE *)this->certifiedOutput;
          pLVar15 = vec<Gluco::Lit>::operator[]((vec<Gluco::Lit> *)&selectors.sz,local_7c);
          local_80 = pLVar15->x;
          iVar10 = Gluco::var((Lit)local_80);
          sig = (uchar *)(ulong)local_7c;
          pLVar15 = vec<Gluco::Lit>::operator[]((vec<Gluco::Lit> *)&selectors.sz,local_7c);
          cr = pLVar15->x;
          iVar13 = Gluco::sign((EVP_PKEY_CTX *)(ulong)cr,sig,siglen,tbs,(size_t)piVar14);
          fprintf(__stream,"%i ",(ulong)((iVar10 + 1) * ((uint)((byte)iVar13 & 1) * -2 + 1)));
          local_7c = local_7c + 1;
        }
        fprintf((FILE *)this->certifiedOutput,"0\n");
      }
      iVar10 = vec<Gluco::Lit>::size((vec<Gluco::Lit> *)&selectors.sz);
      if (iVar10 == 1) {
        pLVar15 = vec<Gluco::Lit>::operator[]((vec<Gluco::Lit> *)&selectors.sz,0);
        local_88 = pLVar15->x;
        uncheckedEnqueue(this,(Lit)local_88,0xffffffff);
        this->nbUn = this->nbUn + 1;
      }
      else {
        bt = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>
                       (&this->ca,(vec<Gluco::Lit> *)&selectors.sz,true);
        pCVar16 = ClauseAllocator::operator[](&this->ca,bt);
        Clause::setLBD(pCVar16,uStack_68);
        pCVar16 = ClauseAllocator::operator[](&this->ca,bt);
        Clause::setSizeWithoutSelectors(pCVar16,confl);
        if (uStack_68 < 3) {
          this->nbDL2 = this->nbDL2 + 1;
        }
        pCVar16 = ClauseAllocator::operator[](&this->ca,bt);
        iVar10 = Clause::size(pCVar16);
        if (iVar10 == 2) {
          this->nbBin = this->nbBin + 1;
        }
        vec<unsigned_int>::push(&this->learnts,(uint *)&bt);
        attachClause(this,bt);
        pCVar16 = ClauseAllocator::operator[](&this->ca,bt);
        claBumpActivity(this,pCVar16);
        pLVar15 = vec<Gluco::Lit>::operator[]((vec<Gluco::Lit> *)&selectors.sz,0);
        uncheckedEnqueue(this,(Lit)pLVar15->x,bt);
      }
      varDecayActivity(this);
      claDecayActivity(this);
    }
    if ((((this->conflictsRestarts != 0) &&
         (iVar10 = bqueue<unsigned_int>::isvalid(&this->lbdQueue), iVar10 != 0)) &&
        (uVar11 = bqueue<unsigned_int>::getavg(&this->lbdQueue),
        (double)(this->sumLBD / (float)this->conflictsRestarts) < (double)uVar11 * this->K)) ||
       ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) break;
    iVar10 = decisionLevel(this);
    if ((iVar10 == 0) && (bVar9 = simplify(this), !bVar9)) {
      lbool::lbool((lbool *)((long)&this_local + 7),'\x01');
      goto LAB_007297a0;
    }
    if (this->curRestart * (long)this->nbclausesbeforereduce <= this->conflicts) {
      iVar10 = vec<unsigned_int>::size(&this->learnts);
      if (iVar10 < 1) {
        __assert_fail("learnts.size()>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                      ,0x46a,"lbool Gluco::Solver::search(int)");
      }
      this->curRestart = this->conflicts / (long)this->nbclausesbeforereduce + 1;
      reduceDB(this);
      this->nbclausesbeforereduce = this->incReduceDB + this->nbclausesbeforereduce;
    }
    local_98.x = -2;
    while( true ) {
      iVar10 = decisionLevel(this);
      iVar13 = vec<Gluco::Lit>::size(&this->assumptions);
      if (iVar13 <= iVar10) break;
      iVar10 = decisionLevel(this);
      pLVar15 = vec<Gluco::Lit>::operator[](&this->assumptions,iVar10);
      local_a4 = pLVar15->x;
      local_9c.x = local_a4;
      local_9d = value(this,(Lit)local_a4);
      lbool::lbool(&local_a5,'\0');
      bVar9 = lbool::operator==(&local_9d,local_a5);
      if (!bVar9) {
        local_ac = local_9c.x;
        local_a6 = value(this,local_9c);
        lbool::lbool(&local_ad,'\x01');
        bVar9 = lbool::operator==(&local_a6,local_ad);
        if (bVar9) {
          p_00 = operator~(local_9c);
          analyzeFinal(this,p_00,&this->conflict);
          lbool::lbool((lbool *)((long)&this_local + 7),'\x01');
          goto LAB_007297a0;
        }
        local_98.x = local_9c.x;
        break;
      }
      newDecisionLevel(this);
    }
    bVar9 = Gluco::Lit::operator==(&local_98,(Lit)0xfffffffe);
    if (bVar9) {
      this->decisions = this->decisions + 1;
      local_98 = pickBranchLit(this);
      bVar9 = Gluco::Lit::operator==(&local_98,(Lit)0xfffffffe);
      if (bVar9) {
        lbool::lbool((lbool *)((long)&this_local + 7),'\0');
LAB_007297a0:
        local_78 = 1;
        vec<Gluco::Lit>::~vec((vec<Gluco::Lit> *)local_58);
        vec<Gluco::Lit>::~vec((vec<Gluco::Lit> *)&selectors.sz);
        return (lbool)this_local._7_1_;
      }
    }
    newDecisionLevel(this);
    uncheckedEnqueue(this,local_98,0xffffffff);
  }
  bqueue<unsigned_int>::fastclear(&this->lbdQueue);
  dVar17 = progressEstimate(this);
  this->progress_estimate = dVar17;
  p.x = 0;
  if (this->incremental != 0) {
    iVar10 = decisionLevel(this);
    iVar13 = vec<Gluco::Lit>::size(&this->assumptions);
    if (iVar10 < iVar13) {
      local_1e8 = decisionLevel(this);
    }
    else {
      local_1e8 = vec<Gluco::Lit>::size(&this->assumptions);
    }
    p.x = local_1e8;
  }
  cancelUntil(this,p.x);
  lbool::lbool((lbool *)((long)&this_local + 7),'\x02');
  goto LAB_007297a0;
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause,selectors;
    unsigned int nblevels,szWoutSelectors;
    bool blocked=false;
    starts++;
    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
          conflicts++; conflictC++;conflictsRestarts++;
          if(conflicts%5000==0 && var_decay<0.95)
            var_decay += 0.01;

          if (verbosity >= 1 && conflicts%verbEveryConflicts==0){
            printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n", 
                   (int)starts,(int)nbstopsrestarts, (int)(conflicts/starts), 
                   (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                   (int)nbReduceDB, nLearnts(), (int)nbDL2,(int)nbRemovedClauses, progressEstimate()*100);
          }
          if (decisionLevel() == 0) {
            return l_False;
            
          }

          trailQueue.push(trail.size());
          // BLOCK RESTART (CP 2012 paper)
          if( conflictsRestarts>LOWER_BOUND_FOR_BLOCKING_RESTART && lbdQueue.isvalid()  && trail.size()>R*trailQueue.getavg()) {
            lbdQueue.fastclear();
            nbstopsrestarts++;
            if(!blocked) {lastblockatrestart=starts;nbstopsrestartssame++;blocked=true;}
          }

            learnt_clause.clear();
            selectors.clear();
            analyze(confl, learnt_clause, selectors,backtrack_level,nblevels,szWoutSelectors);

            lbdQueue.push(nblevels);
            sumLBD += nblevels;
 
            cancelUntil(backtrack_level);

            if (certifiedUNSAT) {
              for (int i = 0; i < learnt_clause.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(learnt_clause[i]) + 1) *
                            (-2 * sign(learnt_clause[i]) + 1) );
              fprintf(certifiedOutput, "0\n");
            }

            if (learnt_clause.size() == 1){
              uncheckedEnqueue(learnt_clause[0]);nbUn++;
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                ca[cr].setLBD(nblevels); 
                ca[cr].setSizeWithoutSelectors(szWoutSelectors);
                if(nblevels<=2) nbDL2++; // stats
                if(ca[cr].size()==2) nbBin++; // stats
                learnts.push(cr);
                attachClause(cr);

                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }
            varDecayActivity();
            claDecayActivity();

           
        }else{

          // Our dynamic restart, see the SAT09 competition compagnion paper 
          if ( (conflictsRestarts && lbdQueue.isvalid() && lbdQueue.getavg()*K > sumLBD/conflictsRestarts) || (pstop && *pstop) ) {
            lbdQueue.fastclear();
            progress_estimate = progressEstimate();
            int bt = 0;
            if(incremental) { // DO NOT BACKTRACK UNTIL 0.. USELESS
              bt = (decisionLevel()<assumptions.size()) ? decisionLevel() : assumptions.size();
            }
            cancelUntil(bt);
            return l_Undef; 
          }

           // Simplify the set of problem clauses:
          if (decisionLevel() == 0 && !simplify()) {
            return l_False;
          }
            // Perform clause database reduction !
            if(conflicts>=curRestart* nbclausesbeforereduce) 
              {
                  
                assert(learnts.size()>0);
                curRestart = (conflicts/ nbclausesbeforereduce)+1;
                reduceDB();
                nbclausesbeforereduce += incReduceDB;
              }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef){
                  //printf("c last restart ## conflicts  :  %d %d \n",conflictC,decisionLevel());
                  // Model found:
                  return l_True;
                }
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}